

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.cpp
# Opt level: O3

void luaV_concat(lua_State *L,int total,int last)

{
  StkId pTVar1;
  Table *pTVar2;
  int iVar3;
  char *str;
  GCObject *pGVar4;
  uint uVar5;
  Table *pTVar7;
  size_t l;
  StkId p1;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  StkId pTVar11;
  ulong uVar6;
  
  uVar6 = (ulong)(uint)total;
  do {
    pTVar1 = L->base;
    pTVar11 = pTVar1 + last;
    p1 = pTVar1 + (long)last + -1;
    if ((pTVar1[(long)last + -1].tt - 3U < 2) &&
       ((pTVar11->tt == 4 || (iVar3 = luaV_tostring(L,pTVar11), iVar3 != 0)))) {
      pTVar7 = (((pTVar11->value).gc)->h).metatable;
      if (pTVar7 == (Table *)0x0) {
        iVar10 = 1;
        if (pTVar11[-1].tt != 4) {
          luaV_tostring(L,p1);
        }
      }
      else {
        uVar9 = 1;
        if (1 < (int)uVar6) {
          uVar8 = 1;
          do {
            if ((p1->tt != 4) && (iVar3 = luaV_tostring(L,p1), uVar9 = uVar8, iVar3 == 0)) break;
            pTVar2 = (((p1->value).gc)->h).metatable;
            if ((Table *)(-(long)pTVar7 - 3U) <= pTVar2) {
              luaG_runerror(L,"string length overflow");
            }
            pTVar7 = (Table *)((long)&pTVar2->next + (long)&pTVar7->next);
            uVar8 = uVar8 + 1;
            p1 = p1 + -1;
            uVar9 = uVar6;
          } while (uVar6 != uVar8);
        }
        str = luaZ_openspace(L,&L->l_G->buff,(size_t)pTVar7);
        iVar3 = (int)uVar9 + 1;
        pTVar11 = pTVar1 + ((long)last - (uVar9 & 0xffffffff));
        l = 0;
        do {
          pTVar11 = pTVar11 + 1;
          pTVar7 = (((pTVar11->value).gc)->h).metatable;
          memcpy(str + l,&(((pTVar11->value).gc)->h).array,(size_t)pTVar7);
          l = (long)&pTVar7->next + l;
          iVar3 = iVar3 + -1;
        } while (1 < iVar3);
        pGVar4 = (GCObject *)luaS_newlstr(L,str,l);
        pTVar1[(long)last + (1 - (uVar9 & 0xffffffff))].value.gc = pGVar4;
        pTVar1[(long)last + (1 - (uVar9 & 0xffffffff))].tt = 4;
        iVar10 = (int)uVar9 + -1;
      }
    }
    else {
      iVar3 = call_binTM(L,p1,pTVar11,p1,TM_CONCAT);
      iVar10 = 1;
      if (iVar3 == 0) {
        luaG_concaterror(L,p1,pTVar11);
      }
    }
    uVar5 = (int)uVar6 - iVar10;
    uVar6 = (ulong)uVar5;
    last = last - iVar10;
    if ((int)uVar5 < 2) {
      return;
    }
  } while( true );
}

Assistant:

void luaV_concat (lua_State *L, int total, int last) {
  do {
    StkId top = L->base + last + 1;
    int n = 2;  /* number of elements handled in this pass (at least 2) */
    if (!(ttisstring(top-2) || ttisnumber(top-2)) || !tostring(L, top-1)) {
      if (!call_binTM(L, top-2, top-1, top-2, TM_CONCAT))
        luaG_concaterror(L, top-2, top-1);
    } else if (tsvalue(top-1)->len == 0)  /* second op is empty? */
      (void)tostring(L, top - 2);  /* result is first op (as string) */
    else {
      /* at least two string values; get as many as possible */
      size_t tl = tsvalue(top-1)->len;
      char *buffer;
      int i;
      /* collect total length */
      for (n = 1; n < total && tostring(L, top-n-1); n++) {
        size_t l = tsvalue(top-n-1)->len;
        if (l >= MAX_SIZET - tl) luaG_runerror(L, "string length overflow");
        tl += l;
      }
      buffer = luaZ_openspace(L, &G(L)->buff, tl);
      tl = 0;
      for (i=n; i>0; i--) {  /* concat all strings */
        size_t l = tsvalue(top-i)->len;
        memcpy(buffer+tl, svalue(top-i), l);
        tl += l;
      }
      setsvalue2s(L, top-n, luaS_newlstr(L, buffer, tl));
    }
    total -= n-1;  /* got `n' strings to create 1 new */
    last -= n-1;
  } while (total > 1);  /* repeat until only 1 result left */
}